

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O1

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig p_Var1;
  int iVar2;
  GLFWbool GVar3;
  char *__s1;
  GLXFBConfig *pp_Var4;
  _GLFWfbconfig *alternatives;
  XVisualInfo *pXVar5;
  _GLFWfbconfig *p_Var6;
  uint uVar7;
  long lVar8;
  int local_40;
  uint local_3c;
  int nativeCount;
  uint local_34 [2];
  int value;
  
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if (__s1 == (char *)0x0) {
    nativeCount._3_1_ = true;
  }
  else {
    iVar2 = strcmp(__s1,"Chromium");
    nativeCount._3_1_ = iVar2 != 0;
  }
  pp_Var4 = (*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_40);
  if (pp_Var4 == (GLXFBConfig *)0x0 || local_40 == 0) {
    uVar7 = 0;
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
  }
  else {
    alternatives = (_GLFWfbconfig *)calloc((long)local_40,0x48);
    if (local_40 < 1) {
      local_3c = 0;
    }
    else {
      lVar8 = 0;
      local_3c = 0;
      do {
        p_Var1 = pp_Var4[lVar8];
        (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8011,(int *)local_34);
        if (((local_34[0] & 1) != 0) &&
           ((*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x8010,(int *)local_34),
           (nativeCount._3_1_ & (local_34[0] & 1) == 0) == 0)) {
          p_Var6 = alternatives + (int)local_3c;
          if ((desired->transparent != 0) &&
             (pXVar5 = (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,p_Var1),
             pXVar5 != (XVisualInfo *)0x0)) {
            GVar3 = _glfwIsVisualTransparentX11(pXVar5->visual);
            p_Var6->transparent = GVar3;
            XFree(pXVar5);
          }
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,8,(int *)local_34);
          p_Var6->redBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,9,(int *)local_34);
          p_Var6->greenBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,10,(int *)local_34);
          p_Var6->blueBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xb,(int *)local_34);
          p_Var6->alphaBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xc,(int *)local_34);
          p_Var6->depthBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xd,(int *)local_34);
          p_Var6->stencilBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xe,(int *)local_34);
          p_Var6->accumRedBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0xf,(int *)local_34);
          p_Var6->accumGreenBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x10,(int *)local_34);
          p_Var6->accumBlueBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x11,(int *)local_34);
          p_Var6->accumAlphaBits = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,7,(int *)local_34);
          p_Var6->auxBuffers = local_34[0];
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,6,(int *)local_34);
          if (local_34[0] != 0) {
            p_Var6->stereo = 1;
          }
          (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,5,(int *)local_34);
          if (local_34[0] != 0) {
            p_Var6->doublebuffer = 1;
          }
          if (_glfw.glx.ARB_multisample != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x186a1,(int *)local_34);
            p_Var6->samples = local_34[0];
          }
          if (_glfw.glx.EXT_framebuffer_sRGB != 0 || _glfw.glx.ARB_framebuffer_sRGB != 0) {
            (*_glfw.glx.GetFBConfigAttrib)(_glfw.x11.display,p_Var1,0x20b2,(int *)local_34);
            p_Var6->sRGB = local_34[0];
          }
          p_Var6->handle = (uintptr_t)p_Var1;
          local_3c = local_3c + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_40);
    }
    p_Var6 = _glfwChooseFBConfig(desired,alternatives,local_3c);
    if (p_Var6 != (_GLFWfbconfig *)0x0) {
      *result = (GLXFBConfig)p_Var6->handle;
    }
    uVar7 = (uint)(p_Var6 != (_GLFWfbconfig *)0x0);
    XFree(pp_Var4);
    free(alternatives);
  }
  return uVar7;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;
        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER))
            u->doublebuffer = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}